

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# beamsplitter.cpp
# Opt level: O2

void beamsplitter_64(void *key,int len,uint seed,void *out)

{
  ulong *puVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  byte bVar7;
  int iVar8;
  ulong *puVar9;
  ulong *puVar10;
  byte bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  uint64_t *puVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong *puVar20;
  long lVar21;
  
  puVar15 = state;
  lVar21 = 1;
  iVar16 = 0;
  uVar3 = ~(len >> 0x1f) & len >> 3;
  lVar6 = (ulong)uVar3 * 8;
  puVar9 = state + 1;
  puVar14 = state + 2;
  puVar1 = state + 3;
  *state = 0x123456789abcdef0;
  puVar15[1] = 0xfedcba987654321;
  puVar15[2] = 0xaccadacca80081e5;
  puVar15[3] = 0xf00baaf00f00baaa;
  for (uVar4 = 0; lVar6 - uVar4 != 0; uVar4 = uVar4 + 8) {
    uVar19 = *(long *)((long)key + uVar4) + lVar21;
    bVar7 = (char)lVar21 + (char)puVar15[iVar16] & 0x3f;
    puVar15[iVar16] = (uVar19 >> bVar7 | uVar19 << 0x40 - bVar7) + puVar15[iVar16];
    puVar10 = puVar9;
    puVar20 = puVar15;
    if (iVar16 == 1) {
LAB_00166e6c:
      uVar19 = *puVar20;
      uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + *puVar10;
      *puVar20 = uVar13;
      uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar17 = uVar19;
      }
      *puVar10 = uVar17;
    }
    else if (iVar16 == 3) {
      iVar16 = -1;
      puVar10 = puVar1;
      puVar20 = puVar14;
      goto LAB_00166e6c;
    }
    iVar16 = iVar16 + 1;
    lVar21 = lVar21 + 1;
  }
  uVar19 = *puVar15;
  lVar21 = (long)len;
  uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[1];
  *puVar15 = uVar13;
  uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
  if ((uVar13 & 0x3f) == 0) {
    uVar17 = uVar19;
  }
  puVar15[1] = uVar17;
  iVar8 = (uVar3 & 3) << 3;
  iVar16 = iVar8;
  while ((long)uVar4 < lVar21) {
    uVar17 = uVar4 + 1;
    bVar11 = *(char *)((long)key + uVar4) + (char)uVar4 + 1;
    uVar19 = uVar4 + 1 + (ulong)state8[iVar16];
    bVar7 = (byte)uVar19 & 7;
    bVar7 = bVar11 >> bVar7 | bVar11 << 8 - bVar7;
    if ((uVar19 & 7) == 0) {
      bVar7 = bVar11;
    }
    state8[iVar16] = bVar7 + state8[iVar16];
    puVar15 = state;
    lVar5 = (long)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) % 3);
    uVar4 = state[lVar5];
    uVar13 = T[(uint)uVar4 & 0x3ff] + uVar4 + state[lVar5 + 1];
    state[lVar5] = uVar13;
    uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar4 >> (uVar13 & 0x3f);
    if ((uVar13 & 0x3f) == 0) {
      uVar19 = uVar4;
    }
    puVar15[lVar5 + 1] = uVar19;
    bVar2 = 0x1e < iVar16;
    uVar4 = uVar17;
    iVar16 = iVar16 + 1;
    if (bVar2) {
      iVar16 = 0;
    }
  }
  uVar4 = *puVar15;
  lVar5 = 1;
  uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[1];
  *puVar15 = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  uVar17 = puVar15[2] + T[(uint)uVar19 & 0x3ff] + uVar19;
  puVar15[1] = uVar17;
  uVar4 = uVar19 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar19 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar4 = uVar19;
  }
  uVar17 = puVar15[3] + T[(uint)uVar4 & 0x3ff] + uVar4;
  puVar15[2] = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  puVar15[3] = uVar19;
  iVar16 = 0;
  for (uVar4 = 0; lVar6 - uVar4 != 0; uVar4 = uVar4 + 8) {
    uVar19 = *(long *)((long)key + uVar4) + lVar5;
    bVar7 = (char)lVar5 + (char)puVar15[iVar16] & 0x3f;
    puVar15[iVar16] = (uVar19 >> bVar7 | uVar19 << 0x40 - bVar7) + puVar15[iVar16];
    puVar9 = puVar15 + 1;
    puVar14 = puVar15;
    if (iVar16 == 1) {
LAB_001670c7:
      uVar19 = *puVar14;
      uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + *puVar9;
      *puVar14 = uVar13;
      uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar17 = uVar19;
      }
      *puVar9 = uVar17;
    }
    else if (iVar16 == 3) {
      iVar16 = -1;
      puVar9 = puVar15 + 3;
      puVar14 = puVar15 + 2;
      goto LAB_001670c7;
    }
    iVar16 = iVar16 + 1;
    lVar5 = lVar5 + 1;
  }
  uVar19 = *puVar15;
  uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[1];
  *puVar15 = uVar13;
  uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
  if ((uVar13 & 0x3f) == 0) {
    uVar17 = uVar19;
  }
  puVar15[1] = uVar17;
  iVar16 = iVar8;
  while ((long)uVar4 < lVar21) {
    uVar17 = uVar4 + 1;
    bVar11 = *(char *)((long)key + uVar4) + (char)uVar4 + 1;
    uVar19 = uVar4 + 1 + (ulong)state8[iVar16];
    bVar7 = (byte)uVar19 & 7;
    bVar7 = bVar11 >> bVar7 | bVar11 << 8 - bVar7;
    if ((uVar19 & 7) == 0) {
      bVar7 = bVar11;
    }
    state8[iVar16] = bVar7 + state8[iVar16];
    puVar15 = state;
    lVar5 = (long)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) % 3);
    uVar4 = state[lVar5];
    uVar13 = T[(uint)uVar4 & 0x3ff] + uVar4 + state[lVar5 + 1];
    state[lVar5] = uVar13;
    uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar4 >> (uVar13 & 0x3f);
    if ((uVar13 & 0x3f) == 0) {
      uVar19 = uVar4;
    }
    puVar15[lVar5 + 1] = uVar19;
    bVar2 = 0x1e < iVar16;
    uVar4 = uVar17;
    iVar16 = iVar16 + 1;
    if (bVar2) {
      iVar16 = 0;
    }
  }
  uVar4 = *puVar15;
  lVar5 = 1;
  uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[1];
  *puVar15 = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  uVar17 = puVar15[2] + T[(uint)uVar19 & 0x3ff] + uVar19;
  puVar15[1] = uVar17;
  uVar4 = uVar19 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar19 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar4 = uVar19;
  }
  uVar17 = puVar15[3] + T[(uint)uVar4 & 0x3ff] + uVar4;
  puVar15[2] = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  iVar16 = 0;
  puVar15[3] = uVar19;
  for (uVar4 = 0; lVar6 - uVar4 != 0; uVar4 = uVar4 + 8) {
    uVar19 = *(long *)((long)key + uVar4) + lVar5;
    bVar7 = (char)lVar5 + (char)puVar15[iVar16] & 0x3f;
    puVar15[iVar16] = (uVar19 >> bVar7 | uVar19 << 0x40 - bVar7) + puVar15[iVar16];
    puVar9 = puVar15 + 1;
    puVar14 = puVar15;
    if (iVar16 == 1) {
LAB_0016730a:
      uVar19 = *puVar14;
      uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + *puVar9;
      *puVar14 = uVar13;
      uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar17 = uVar19;
      }
      *puVar9 = uVar17;
    }
    else if (iVar16 == 3) {
      iVar16 = -1;
      puVar9 = puVar15 + 3;
      puVar14 = puVar15 + 2;
      goto LAB_0016730a;
    }
    iVar16 = iVar16 + 1;
    lVar5 = lVar5 + 1;
  }
  uVar19 = *puVar15;
  uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[1];
  *puVar15 = uVar13;
  uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
  if ((uVar13 & 0x3f) == 0) {
    uVar17 = uVar19;
  }
  puVar15[1] = uVar17;
  iVar16 = iVar8;
  while ((long)uVar4 < lVar21) {
    uVar17 = uVar4 + 1;
    bVar11 = *(char *)((long)key + uVar4) + (char)uVar4 + 1;
    uVar19 = uVar4 + 1 + (ulong)state8[iVar16];
    bVar7 = (byte)uVar19 & 7;
    bVar7 = bVar11 >> bVar7 | bVar11 << 8 - bVar7;
    if ((uVar19 & 7) == 0) {
      bVar7 = bVar11;
    }
    state8[iVar16] = bVar7 + state8[iVar16];
    puVar15 = state;
    lVar5 = (long)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) % 3);
    uVar4 = state[lVar5];
    uVar13 = T[(uint)uVar4 & 0x3ff] + uVar4 + state[lVar5 + 1];
    state[lVar5] = uVar13;
    uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar4 >> (uVar13 & 0x3f);
    if ((uVar13 & 0x3f) == 0) {
      uVar19 = uVar4;
    }
    puVar15[lVar5 + 1] = uVar19;
    bVar2 = 0x1e < iVar16;
    uVar4 = uVar17;
    iVar16 = iVar16 + 1;
    if (bVar2) {
      iVar16 = 0;
    }
  }
  uVar4 = *puVar15;
  uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[1];
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  uVar13 = puVar15[2] + T[(uint)uVar19 & 0x3ff] + uVar19;
  uVar4 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
  if ((uVar13 & 0x3f) == 0) {
    uVar4 = uVar19;
  }
  uVar12 = puVar15[3] + T[(uint)uVar4 & 0x3ff] + uVar4;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar4 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  uVar4 = ((ulong)(seed - 2) << 0x20) + 1 + (ulong)(0xc5550690 - seed);
  bVar7 = (byte)uVar17 + 1 & 0x3f;
  uVar17 = (uVar4 >> bVar7 | uVar4 << 0x40 - bVar7) + uVar17;
  uVar13 = T[(uint)uVar17 & 0x3ff] + uVar17 + uVar13;
  uVar18 = uVar17 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar17 >> (uVar13 & 0x3f);
  if ((uVar13 & 0x3f) == 0) {
    uVar18 = uVar17;
  }
  uVar18 = T[(uint)uVar13 & 0x3ff] + uVar13 + uVar18;
  uVar17 = uVar13 << ((ulong)(byte)-((byte)uVar18 & 0x3f) & 0x3f) | uVar13 >> (uVar18 & 0x3f);
  if ((uVar18 & 0x3f) == 0) {
    uVar17 = uVar13;
  }
  uVar12 = uVar12 + T[(uint)uVar17 & 0x3ff] + uVar17;
  uVar13 = uVar17 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar17 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar13 = uVar17;
  }
  uVar17 = uVar19 + T[(uint)uVar13 & 0x3ff] + uVar13;
  uVar19 = uVar13 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar13 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar13;
  }
  bVar7 = (byte)uVar18 + 1 & 0x3f;
  uVar18 = (uVar4 >> bVar7 | uVar4 << 0x40 - bVar7) + uVar18;
  uVar12 = T[(uint)uVar18 & 0x3ff] + uVar18 + uVar12;
  uVar4 = uVar18 << ((ulong)(byte)-((byte)uVar12 & 0x3f) & 0x3f) | uVar18 >> (uVar12 & 0x3f);
  if ((uVar12 & 0x3f) == 0) {
    uVar4 = uVar18;
  }
  uVar4 = T[(uint)uVar12 & 0x3ff] + uVar12 + uVar4;
  *puVar15 = uVar4;
  uVar13 = uVar12 << ((ulong)(byte)-((byte)uVar4 & 0x3f) & 0x3f) | uVar12 >> (uVar4 & 0x3f);
  if ((uVar4 & 0x3f) == 0) {
    uVar13 = uVar12;
  }
  uVar17 = uVar17 + T[(uint)uVar13 & 0x3ff] + uVar13;
  puVar15[1] = uVar17;
  uVar4 = uVar13 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar13 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar4 = uVar13;
  }
  uVar17 = uVar19 + T[(uint)uVar4 & 0x3ff] + uVar4;
  puVar15[2] = uVar17;
  lVar5 = 1;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  iVar16 = 0;
  puVar15[3] = uVar19;
  for (uVar4 = 0; lVar6 - uVar4 != 0; uVar4 = uVar4 + 8) {
    uVar19 = *(long *)((long)key + uVar4) + lVar5;
    bVar7 = (char)lVar5 + (char)puVar15[iVar16] & 0x3f;
    puVar15[iVar16] = (uVar19 >> bVar7 | uVar19 << 0x40 - bVar7) + puVar15[iVar16];
    puVar9 = puVar15 + 1;
    puVar14 = puVar15;
    if (iVar16 == 1) {
LAB_001676e4:
      uVar19 = *puVar14;
      uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + *puVar9;
      *puVar14 = uVar13;
      uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar17 = uVar19;
      }
      *puVar9 = uVar17;
    }
    else if (iVar16 == 3) {
      iVar16 = -1;
      puVar9 = puVar15 + 3;
      puVar14 = puVar15 + 2;
      goto LAB_001676e4;
    }
    iVar16 = iVar16 + 1;
    lVar5 = lVar5 + 1;
  }
  uVar19 = *puVar15;
  uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[1];
  *puVar15 = uVar13;
  uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
  if ((uVar13 & 0x3f) == 0) {
    uVar17 = uVar19;
  }
  puVar15[1] = uVar17;
  iVar16 = iVar8;
  while ((long)uVar4 < lVar21) {
    uVar17 = uVar4 + 1;
    bVar11 = *(char *)((long)key + uVar4) + (char)uVar4 + 1;
    uVar19 = uVar4 + 1 + (ulong)state8[iVar16];
    bVar7 = (byte)uVar19 & 7;
    bVar7 = bVar11 >> bVar7 | bVar11 << 8 - bVar7;
    if ((uVar19 & 7) == 0) {
      bVar7 = bVar11;
    }
    state8[iVar16] = bVar7 + state8[iVar16];
    puVar15 = state;
    lVar5 = (long)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) % 3);
    uVar4 = state[lVar5];
    uVar13 = T[(uint)uVar4 & 0x3ff] + uVar4 + state[lVar5 + 1];
    state[lVar5] = uVar13;
    uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar4 >> (uVar13 & 0x3f);
    if ((uVar13 & 0x3f) == 0) {
      uVar19 = uVar4;
    }
    puVar15[lVar5 + 1] = uVar19;
    bVar2 = 0x1e < iVar16;
    uVar4 = uVar17;
    iVar16 = iVar16 + 1;
    if (bVar2) {
      iVar16 = 0;
    }
  }
  uVar4 = *puVar15;
  lVar5 = 1;
  uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[1];
  *puVar15 = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  uVar17 = puVar15[2] + T[(uint)uVar19 & 0x3ff] + uVar19;
  puVar15[1] = uVar17;
  uVar4 = uVar19 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar19 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar4 = uVar19;
  }
  uVar17 = puVar15[3] + T[(uint)uVar4 & 0x3ff] + uVar4;
  puVar15[2] = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  iVar16 = 0;
  puVar15[3] = uVar19;
  for (uVar4 = 0; lVar6 - uVar4 != 0; uVar4 = uVar4 + 8) {
    uVar19 = *(long *)((long)key + uVar4) + lVar5;
    bVar7 = (char)lVar5 + (char)puVar15[iVar16] & 0x3f;
    puVar15[iVar16] = (uVar19 >> bVar7 | uVar19 << 0x40 - bVar7) + puVar15[iVar16];
    puVar9 = puVar15 + 1;
    puVar14 = puVar15;
    if (iVar16 == 1) {
LAB_0016792e:
      uVar19 = *puVar14;
      uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + *puVar9;
      *puVar14 = uVar13;
      uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar17 = uVar19;
      }
      *puVar9 = uVar17;
    }
    else if (iVar16 == 3) {
      iVar16 = -1;
      puVar9 = puVar15 + 3;
      puVar14 = puVar15 + 2;
      goto LAB_0016792e;
    }
    iVar16 = iVar16 + 1;
    lVar5 = lVar5 + 1;
  }
  uVar19 = *puVar15;
  uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[1];
  *puVar15 = uVar13;
  uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
  if ((uVar13 & 0x3f) == 0) {
    uVar17 = uVar19;
  }
  puVar15[1] = uVar17;
  iVar16 = iVar8;
  while ((long)uVar4 < lVar21) {
    uVar17 = uVar4 + 1;
    bVar11 = *(char *)((long)key + uVar4) + (char)uVar4 + 1;
    uVar19 = uVar4 + 1 + (ulong)state8[iVar16];
    bVar7 = (byte)uVar19 & 7;
    bVar7 = bVar11 >> bVar7 | bVar11 << 8 - bVar7;
    if ((uVar19 & 7) == 0) {
      bVar7 = bVar11;
    }
    state8[iVar16] = bVar7 + state8[iVar16];
    puVar15 = state;
    lVar5 = (long)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) % 3);
    uVar4 = state[lVar5];
    uVar13 = T[(uint)uVar4 & 0x3ff] + uVar4 + state[lVar5 + 1];
    state[lVar5] = uVar13;
    uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar4 >> (uVar13 & 0x3f);
    if ((uVar13 & 0x3f) == 0) {
      uVar19 = uVar4;
    }
    puVar15[lVar5 + 1] = uVar19;
    bVar2 = 0x1e < iVar16;
    uVar4 = uVar17;
    iVar16 = iVar16 + 1;
    if (bVar2) {
      iVar16 = 0;
    }
  }
  uVar4 = *puVar15;
  uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[1];
  *puVar15 = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  uVar17 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[2];
  puVar15[1] = uVar17;
  uVar4 = uVar19 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar19 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar4 = uVar19;
  }
  uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[3];
  puVar15[2] = uVar17;
  uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
  if ((uVar17 & 0x3f) == 0) {
    uVar19 = uVar4;
  }
  iVar16 = 0;
  puVar15[3] = uVar19;
  puVar15 = state;
  lVar5 = 1;
  puVar9 = state + 2;
  puVar14 = state + 3;
  puVar1 = state + 1;
  uVar4 = 0;
  do {
    if (lVar6 - uVar4 == 0) {
      uVar19 = *puVar15;
      uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[1];
      *puVar15 = uVar13;
      uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar17 = uVar19;
      }
      puVar15[1] = uVar17;
      while ((long)uVar4 < lVar21) {
        uVar17 = uVar4 + 1;
        bVar11 = *(char *)((long)key + uVar4) + (char)uVar4 + 1;
        uVar19 = uVar4 + 1 + (ulong)state8[iVar8];
        bVar7 = (byte)uVar19 & 7;
        bVar7 = bVar11 >> bVar7 | bVar11 << 8 - bVar7;
        if ((uVar19 & 7) == 0) {
          bVar7 = bVar11;
        }
        state8[iVar8] = bVar7 + state8[iVar8];
        puVar15 = state;
        lVar6 = (long)(int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) %
                           3);
        uVar4 = state[lVar6];
        uVar13 = T[(uint)uVar4 & 0x3ff] + uVar4 + state[lVar6 + 1];
        state[lVar6] = uVar13;
        uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar4 >> (uVar13 & 0x3f);
        if ((uVar13 & 0x3f) == 0) {
          uVar19 = uVar4;
        }
        puVar15[lVar6 + 1] = uVar19;
        bVar2 = 0x1e < iVar8;
        uVar4 = uVar17;
        iVar8 = iVar8 + 1;
        if (bVar2) {
          iVar8 = 0;
        }
      }
      uVar4 = *puVar15;
      uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[1];
      *puVar15 = uVar17;
      uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
      if ((uVar17 & 0x3f) == 0) {
        uVar19 = uVar4;
      }
      uVar17 = T[(uint)uVar19 & 0x3ff] + uVar19 + puVar15[2];
      puVar15[1] = uVar17;
      uVar4 = uVar19 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar19 >> (uVar17 & 0x3f);
      if ((uVar17 & 0x3f) == 0) {
        uVar4 = uVar19;
      }
      uVar17 = T[(uint)uVar4 & 0x3ff] + uVar4 + puVar15[3];
      puVar15[2] = uVar17;
      uVar19 = uVar4 << ((ulong)(byte)-((byte)uVar17 & 0x3f) & 0x3f) | uVar4 >> (uVar17 & 0x3f);
      if ((uVar17 & 0x3f) == 0) {
        uVar19 = uVar4;
      }
      puVar15[3] = uVar19;
      *(ulong *)out = uVar19 + uVar17;
      return;
    }
    uVar19 = *(long *)((long)key + uVar4) + lVar5;
    bVar7 = (char)lVar5 + (char)puVar15[iVar16] & 0x3f;
    puVar15[iVar16] = (uVar19 >> bVar7 | uVar19 << 0x40 - bVar7) + puVar15[iVar16];
    puVar10 = puVar1;
    puVar20 = puVar15;
    if (iVar16 == 1) {
LAB_00167b76:
      uVar19 = *puVar20;
      uVar13 = T[(uint)uVar19 & 0x3ff] + uVar19 + *puVar10;
      *puVar20 = uVar13;
      uVar17 = uVar19 << ((ulong)(byte)-((byte)uVar13 & 0x3f) & 0x3f) | uVar19 >> (uVar13 & 0x3f);
      if ((uVar13 & 0x3f) == 0) {
        uVar17 = uVar19;
      }
      *puVar10 = uVar17;
    }
    else if (iVar16 == 3) {
      iVar16 = -1;
      puVar10 = puVar14;
      puVar20 = puVar9;
      goto LAB_00167b76;
    }
    iVar16 = iVar16 + 1;
    uVar4 = uVar4 + 8;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void beamsplitter_64 ( const void * key, int len, unsigned seed, void * out )
    {
      const uint8_t *key8Arr = (uint8_t *)key;
      const uint64_t *key64Arr = (uint64_t *)key;

      uint8_t seedbuf[8] = {0};
      uint8_t *seed8Arr = (uint8_t *)seedbuf;
      uint64_t *seed64Arr = (uint64_t *)seedbuf;
      uint32_t *seed32Arr = (uint32_t *)seedbuf;

      // the cali number from the Matrix (1999)
      seed32Arr[0] = 0xc5550690;
      seed32Arr[0] -= seed;
      seed32Arr[1] = ~(1 - seed);

      // nothing up my sleeve
      state[0] = 0x123456789abcdef0;
      state[1] = 0x0fedcba987654321;
      state[2] = 0xaccadacca80081e5;
      state[3] = 0xf00baaf00f00baaa;

      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( seed64Arr, seed8Arr, 8 );
      //round( state, state8, STATE   );
      round( seed64Arr, seed8Arr, 8 );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );
      round( key64Arr, key8Arr, len );

      /*
      //printf("state = %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1], state[2], state[3] );
      */

      //printf("state = %#018" PRIx64 " %#018" PRIx64 "\n",
      //  state[0], state[1] );

      uint8_t output[STATE] = {0};
      uint64_t *h = (uint64_t *)output;

      // The new combination step
      h[0] = state[2];
      h[1] = state[3];

      h[0] += h[1];

      ((uint64_t *)out)[0] = h[0];
    }